

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

SharedPtr<vkt::Draw::Image> __thiscall
vkt::Draw::Image::create
          (Image *this,DeviceInterface *vk,VkDevice device,VkImageCreateInfo *createInfo)

{
  VkFormat format;
  deUint32 levelCount;
  deUint32 layerCount;
  VkImageCreateInfo *device_00;
  VkDevice vk_00;
  Image *this_00;
  VkExtent3D *extend;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<vkt::Draw::Image> SVar1;
  Move<vk::Handle<(vk::HandleType)9>_> local_48;
  VkImageCreateInfo *local_28;
  VkImageCreateInfo *createInfo_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  local_28 = createInfo;
  createInfo_local = (VkImageCreateInfo *)device;
  device_local = (VkDevice)vk;
  vk_local = (DeviceInterface *)this;
  this_00 = (Image *)operator_new(0x70);
  vk_00 = device_local;
  device_00 = createInfo_local;
  format = local_28->format;
  levelCount = local_28->mipLevels;
  extend = &local_28->extent;
  layerCount = local_28->arrayLayers;
  ::vk::createImage(&local_48,(DeviceInterface *)device_local,(VkDevice)createInfo_local,local_28,
                    (VkAllocationCallbacks *)0x0);
  Image(this_00,(DeviceInterface *)vk_00,(VkDevice)device_00,format,extend,levelCount,layerCount,
        &local_48);
  de::SharedPtr<vkt::Draw::Image>::SharedPtr((SharedPtr<vkt::Draw::Image> *)this,this_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_48);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = this;
  return SVar1;
}

Assistant:

de::SharedPtr<Image> Image::create(const vk::DeviceInterface&	vk,
								   vk::VkDevice					device,
								   const vk::VkImageCreateInfo	&createInfo)
{
	return de::SharedPtr<Image>(new Image(vk, device, createInfo.format, createInfo.extent,
								createInfo.mipLevels, createInfo.arrayLayers,
								vk::createImage(vk, device, &createInfo)));
}